

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IIR2xResampler.cpp
# Opt level: O0

void __thiscall
SRCTools::IIRResampler::Constants::Constants
          (Constants *this,uint useSectionsCount,IIRCoefficient useFIR,IIRSection *useSections,
          Quality quality)

{
  undefined1 auVar1 [16];
  uint uVar2;
  ulong uVar3;
  SectionBuffer *paBVar4;
  BufferedSample *e;
  BufferedSample *s;
  uint local_28;
  uint delayLineSize;
  uint sectionsSize;
  Quality quality_local;
  IIRSection *useSections_local;
  IIRCoefficient useFIR_local;
  uint useSectionsCount_local;
  Constants *this_local;
  
  if (quality == CUSTOM) {
    this->sectionsCount = useSectionsCount;
    this->fir = useFIR;
    this->sections = useSections;
  }
  else {
    if (quality == FAST) {
      this->fir = 0.0008828378;
      this->sections = (IIRSection *)SECTIONS_FAST;
      local_28 = 0x40;
    }
    else if (quality == GOOD) {
      this->fir = 0.0008910546;
      this->sections = (IIRSection *)SECTIONS_GOOD;
      local_28 = 0x60;
    }
    else if (quality == BEST) {
      this->fir = 0.0014313792;
      this->sections = (IIRSection *)SECTIONS_BEST;
      local_28 = 0x90;
    }
    else {
      local_28 = 0;
    }
    this->sectionsCount = local_28 >> 4;
  }
  uVar2 = this->sectionsCount << 1;
  auVar1 = ZEXT416(uVar2) * ZEXT816(8);
  uVar3 = auVar1._0_8_;
  if (auVar1._8_8_ != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  paBVar4 = (SectionBuffer *)operator_new__(uVar3);
  this->buffer = paBVar4;
  paBVar4 = this->buffer;
  e = *this->buffer;
  while (e < paBVar4 + uVar2) {
    *e = 0.0;
    e = e + 1;
  }
  return;
}

Assistant:

IIRResampler::Constants::Constants(const unsigned int useSectionsCount, const IIRCoefficient useFIR, const IIRSection useSections[], const Quality quality) {
	if (quality == CUSTOM) {
		sectionsCount = useSectionsCount;
		fir = useFIR;
		sections = useSections;
	} else {
		unsigned int sectionsSize;
		switch (quality) {
		case FAST:
			fir = FIR_FAST;
			sections = SECTIONS_FAST;
			sectionsSize = sizeof(SECTIONS_FAST);
			break;
		case GOOD:
			fir = FIR_GOOD;
			sections = SECTIONS_GOOD;
			sectionsSize = sizeof(SECTIONS_GOOD);
			break;
		case BEST:
			fir = FIR_BEST;
			sections = SECTIONS_BEST;
			sectionsSize = sizeof(SECTIONS_BEST);
			break;
		default:
			sectionsSize = 0;
			break;
		}
		sectionsCount = (sectionsSize / sizeof(IIRSection));
	}
	const unsigned int delayLineSize = IIR_RESAMPER_CHANNEL_COUNT * sectionsCount;
	buffer = new SectionBuffer[delayLineSize];
	BufferedSample *s = buffer[0];
	BufferedSample *e = buffer[delayLineSize];
	while (s < e) *(s++) = 0;
}